

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::applyFilters
          (FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *filters)

{
  pointer pMVar1;
  ostringstream *this_00;
  TestLog *log;
  pointer pMVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer puVar4;
  ulong uVar5;
  ostringstream *this_01;
  ulong uVar6;
  char *pcVar7;
  pointer puVar8;
  pointer puVar9;
  ScopedLogSection section;
  string local_208;
  long local_1e8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_1e0;
  ulong local_1d8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  log = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  local_1e0 = filters;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Setting message filters",(allocator<char> *)&local_1d0);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b0,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)local_1b0);
  iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1e8 = CONCAT44(extraout_var,iVar3);
  this_00 = (ostringstream *)(local_1b0 + 8);
  uVar5 = 0;
  while( true ) {
    this_01 = (ostringstream *)(local_1b0 + 8);
    pMVar2 = (local_1e0->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_1e0->
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x30) <= uVar5)
    break;
    pMVar1 = pMVar2 + uVar5;
    puVar4 = pMVar2[uVar5].ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = pMVar2[uVar5].ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = uVar5;
    if (puVar4 == puVar8) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,"Setting messages with");
      std::operator<<((ostream *)this_01," source ");
      local_208._M_string_length._0_4_ = pMVar1->source;
      local_208._M_dataplus._M_p = (pointer)glu::getDebugMessageSourceName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_208,(ostream *)this_01);
      std::operator<<((ostream *)this_01,", type ");
      local_1c0.m_value = pMVar1->type;
      local_1c0.m_getName = glu::getDebugMessageTypeName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_01);
      std::operator<<((ostream *)this_01," and severity ");
      local_1d0.m_value = pMVar1->severity;
      local_1d0.m_getName = glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_01);
      pcVar7 = " to disabled";
      if (pMVar1->enabled != false) {
        pcVar7 = " to enabled";
      }
      std::operator<<((ostream *)this_01,pcVar7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      puVar4 = (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      puVar8 = (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      uVar5 = (long)puVar8 - (long)puVar4;
    }
    else {
      for (uVar6 = 0; uVar5 = (long)puVar8 - (long)puVar4, uVar6 < (ulong)((long)uVar5 >> 2);
          uVar6 = uVar6 + 1) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Setting message (");
        local_208._M_dataplus._M_p = *(pointer *)pMVar1;
        local_208._M_string_length._0_4_ =
             *(GLenum *)
              (*(long *)&(pMVar1->ids).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + uVar6 * 4);
        anon_unknown_1::operator<<((ostream *)this_00,(MessageID *)&local_208);
        std::operator<<((ostream *)this_00,") to ");
        pcVar7 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
        if (pMVar1->enabled != false) {
          pcVar7 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
        }
        std::operator<<((ostream *)this_00,pcVar7 + 0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        puVar4 = (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar8 = (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    puVar9 = (pointer)0x0;
    if (puVar4 != puVar8) {
      puVar9 = puVar4;
    }
    (**(code **)(local_1e8 + 0x428))
              (pMVar1->source,pMVar1->type,pMVar1->severity,uVar5 >> 2,puVar9,pMVar1->enabled);
    uVar5 = local_1d8 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void FilterCase::applyFilters (const vector<MessageFilter>& filters) const
{
	TestLog&					log		= m_testCtx.getLog();
	const tcu::ScopedLogSection	section	(log, "", "Setting message filters");
	const glw::Functions&		gl		= m_context.getRenderContext().getFunctions();

	for (size_t filterNdx = 0; filterNdx < filters.size(); filterNdx++)
	{
		const MessageFilter& filter = filters[filterNdx];

		if (filter.ids.empty())
			log << TestLog::Message << "Setting messages with"
				<< " source " << glu::getDebugMessageSourceStr(filter.source)
				<< ", type " << glu::getDebugMessageTypeStr(filter.type)
				<< " and severity " << glu::getDebugMessageSeverityStr(filter.severity)
				<< (filter.enabled ? " to enabled" : " to disabled")
				<< TestLog::EndMessage;
		else
		{
			for (size_t ndx = 0; ndx < filter.ids.size(); ndx++)
				log << TestLog::Message << "Setting message (" << MessageID(filter.source, filter.type, filter.ids[ndx]) << ") to " << (filter.enabled ? "enabled" : "disabled") << TestLog::EndMessage;
		}

		gl.debugMessageControl(filter.source, filter.type, filter.severity, GLsizei(filter.ids.size()), filter.ids.empty() ? DE_NULL : &filter.ids[0], filter.enabled);
	}
}